

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

int __thiscall
ImFontAtlas::AddCustomRectFontGlyph
          (ImFontAtlas *this,ImFont *font,ImWchar id,int width,int height,float advance_x,
          ImVec2 *offset)

{
  ImVec2 IVar1;
  ImFontAtlasCustomRect *__src;
  int iVar2;
  ImFontAtlasCustomRect *__dest;
  int iVar3;
  int iVar4;
  
  IVar1 = *offset;
  iVar2 = (this->CustomRects).Size;
  if (iVar2 == (this->CustomRects).Capacity) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    iVar4 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar4 = iVar3;
    }
    __dest = (ImFontAtlasCustomRect *)ImGui::MemAlloc((long)iVar4 << 5);
    __src = (this->CustomRects).Data;
    if (__src != (ImFontAtlasCustomRect *)0x0) {
      memcpy(__dest,__src,(long)(this->CustomRects).Size << 5);
      ImGui::MemFree((this->CustomRects).Data);
    }
    (this->CustomRects).Data = __dest;
    (this->CustomRects).Capacity = iVar4;
    iVar2 = (this->CustomRects).Size;
  }
  else {
    __dest = (this->CustomRects).Data;
  }
  __dest[iVar2].Width = (unsigned_short)width;
  __dest[iVar2].Height = (unsigned_short)height;
  __dest[iVar2].X = 0xffff;
  __dest[iVar2].Y = 0xffff;
  __dest[iVar2].GlyphID = (uint)id;
  __dest[iVar2].GlyphAdvanceX = advance_x;
  __dest[iVar2].GlyphOffset = IVar1;
  __dest[iVar2].Font = font;
  iVar2 = (this->CustomRects).Size;
  (this->CustomRects).Size = iVar2 + 1;
  return iVar2;
}

Assistant:

int ImFontAtlas::AddCustomRectFontGlyph(ImFont* font, ImWchar id, int width, int height, float advance_x, const ImVec2& offset)
{
#ifdef IMGUI_USE_WCHAR32
    IM_ASSERT(id <= IM_UNICODE_CODEPOINT_MAX);
#endif
    IM_ASSERT(font != NULL);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    r.GlyphID = id;
    r.GlyphAdvanceX = advance_x;
    r.GlyphOffset = offset;
    r.Font = font;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}